

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O1

Items * GherkinLine_table_cells(GherkinLine *line)

{
  wchar_t *pwVar1;
  ulong uVar2;
  _Bool _Var3;
  wchar_t *current_pos;
  wchar_t *pwVar4;
  Span *pSVar5;
  Items *pIVar6;
  size_t sVar7;
  wchar_t *pwVar8;
  long lVar9;
  wchar_t *pwVar10;
  ulong uVar11;
  wchar_t *pwVar12;
  ulong uVar13;
  int iVar14;
  wchar_t wVar15;
  ulong uVar16;
  wchar_t *current_pos_2;
  wchar_t *current_pos_1;
  wchar_t *pwVar17;
  
  pwVar12 = line->trimmed_line;
  iVar14 = 0;
  pwVar4 = pwVar12;
  while ((pwVar4 != (wchar_t *)0x0 && (*pwVar4 != L'\0'))) {
LAB_0011ff3c:
    wVar15 = *pwVar4;
    if (wVar15 == L'\\') {
      pwVar4 = pwVar4 + 1;
LAB_0011ff52:
      pwVar4 = pwVar4 + 1;
      goto LAB_0011ff3c;
    }
    if (wVar15 != L'\0') {
      if (wVar15 == L'|') goto LAB_0011ff5a;
      goto LAB_0011ff52;
    }
    pwVar4 = (wchar_t *)0x0;
LAB_0011ff5a:
    if (pwVar4 == (wchar_t *)0x0) {
      pwVar4 = (wchar_t *)0x0;
    }
    else if (*pwVar4 != L'\0') {
      iVar14 = iVar14 + 1;
      pwVar4 = pwVar4 + 1;
    }
  }
  if (iVar14 < 2) {
    pIVar6 = (Items *)0x0;
  }
  else {
    wVar15 = iVar14 + L'\xffffffff';
    pSVar5 = (Span *)malloc((long)wVar15 << 4);
    lVar9 = 0;
    do {
      *(undefined4 *)((long)&pSVar5->column + lVar9) = 0;
      *(undefined8 *)((long)&pSVar5->text + lVar9) = 0;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(uint)wVar15 << 4 != lVar9);
    pIVar6 = (Items *)malloc(0x10);
    pIVar6->count = wVar15;
    pIVar6->items = pSVar5;
    uVar13 = 1;
    if (L'\x01' < wVar15) {
      uVar13 = (ulong)(uint)wVar15;
    }
    uVar16 = 0;
    do {
      pwVar4 = line->line_text;
      pwVar8 = pwVar12;
LAB_00120005:
      wVar15 = *pwVar8;
      if (wVar15 == L'\\') {
        pwVar8 = pwVar8 + 1;
LAB_0012001d:
        pwVar8 = pwVar8 + 1;
        goto LAB_00120005;
      }
      if (wVar15 != L'\0') {
        if (wVar15 == L'|') goto LAB_00120026;
        goto LAB_0012001d;
      }
      pwVar8 = (wchar_t *)0x0;
LAB_00120026:
      if ((pwVar8 == (wchar_t *)0x0) || (*pwVar8 == L'\0')) {
LAB_0012002b:
        pwVar10 = (wchar_t *)0x0;
      }
      else {
        pwVar8 = pwVar8 + 1;
        pwVar10 = pwVar8;
LAB_00120051:
        wVar15 = *pwVar10;
        if (wVar15 == L'\\') {
          pwVar10 = pwVar10 + 1;
LAB_00120069:
          pwVar10 = pwVar10 + 1;
          goto LAB_00120051;
        }
        if (wVar15 != L'\0') {
          if (wVar15 == L'|') goto LAB_00120072;
          goto LAB_00120069;
        }
        pwVar10 = (wchar_t *)0x0;
LAB_00120072:
        if ((pwVar10 == (wchar_t *)0x0) || (*pwVar10 == L'\0')) goto LAB_0012002b;
        while ((pwVar8 < pwVar10 && (_Var3 = StringUtilities_is_whitespace(*pwVar8), _Var3))) {
          pwVar8 = pwVar8 + 1;
        }
        uVar2 = (long)pwVar10 - (long)pwVar8;
        pwVar17 = pwVar10;
        do {
          uVar11 = uVar2;
          if (pwVar17 <= pwVar8) break;
          pwVar1 = pwVar17 + -1;
          pwVar17 = pwVar17 + -1;
          _Var3 = StringUtilities_is_whitespace(*pwVar1);
          uVar2 = uVar11 - 4;
        } while (_Var3);
        sVar7 = StringUtilities_code_point_length_for_part
                          (pwVar12,(wchar_t)((ulong)((long)pwVar8 - (long)pwVar12) >> 2));
        pSVar5[uVar16].column =
             (int)sVar7 + (int)((ulong)((long)pwVar12 - (long)pwVar4) >> 2) + L'\x01';
        pwVar8 = StringUtilities_copy_string_part(pwVar8,(wchar_t)(uVar11 >> 2));
        pwVar12 = pwVar8;
        pwVar4 = pwVar8;
        while (pwVar17 = pwVar4, wVar15 = *pwVar17, wVar15 == L'\\') {
          wVar15 = pwVar17[1];
          if ((wVar15 == L'\\') || (wVar15 == L'|')) {
LAB_00120149:
            wVar15 = pwVar17[1];
            pwVar4 = pwVar17 + 1;
            if (wVar15 != L'\0') {
              pwVar4 = pwVar17 + 2;
              *pwVar12 = wVar15;
LAB_00120159:
              pwVar12 = pwVar12 + 1;
            }
          }
          else {
            if (wVar15 != L'n') {
              *pwVar12 = L'\\';
              pwVar12 = pwVar12 + 1;
              goto LAB_00120149;
            }
            *pwVar12 = L'\n';
            pwVar12 = pwVar12 + 1;
            pwVar4 = pwVar17 + 2;
          }
        }
        if (wVar15 != L'\0') {
          pwVar4 = pwVar17 + 1;
          *pwVar12 = wVar15;
          goto LAB_00120159;
        }
        *pwVar12 = L'\0';
        pSVar5[uVar16].text = pwVar8;
      }
    } while ((pwVar10 != (wchar_t *)0x0) &&
            (uVar16 = uVar16 + 1, pwVar12 = pwVar10, uVar16 != uVar13));
  }
  return pIVar6;
}

Assistant:

const Items* GherkinLine_table_cells(const GherkinLine* line) {
    int item_count = calculate_cell_count(line->trimmed_line);
    if (item_count == 0)
        return (Items*)0;
    Span* items = (Span*)malloc(item_count * sizeof(Span));
    int i;
    for (i = 0; i < item_count; ++i) {
        items[i].column = 0;
        items[i].text = 0;
    }
    Items* item_array = (Items*)malloc(sizeof(Items));
    item_array->count = item_count;
    item_array->items = items;
    const wchar_t* current_pos = line->trimmed_line;
    for (i = 0; i < item_count; ++i) {
        current_pos = populate_cell_data(&items[i], current_pos, current_pos - line->line_text);
        if (!current_pos)
            break;
    }
    return item_array;
}